

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void substring_to_example(vw *all,example *ae,substring example)

{
  size_t sVar1;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  bool bVar2;
  TC_parser<false> parser_line_1;
  TC_parser<true> parser_line;
  substring tag;
  substring label_space;
  char *tab_location;
  char *bar_location;
  v_array<substring> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  v_array<char> *in_stack_fffffffffffffe40;
  example *in_stack_fffffffffffffe50;
  vw *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  v_array<substring> *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  char in_stack_fffffffffffffe77;
  substring in_stack_fffffffffffffe78;
  TC_parser<true> local_128;
  substring local_80;
  substring local_70;
  substring local_60;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  long local_20;
  undefined8 *local_18;
  char *local_10;
  char *local_8;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_10 = in_RDX;
  local_8 = in_RCX;
  (**(code **)(in_RDI[1] + 0x338))(in_RSI + 0x6828);
  local_28 = safe_index(local_10,'|',local_8);
  local_30 = safe_index(local_10,'\t',local_28);
  if (local_30 == local_28) {
    local_40 = local_10;
  }
  else {
    local_40 = local_30 + 1;
  }
  local_38 = local_28;
  if (*local_10 == '|') {
    v_array<substring>::clear(in_stack_fffffffffffffe30);
  }
  else {
    local_50 = local_40;
    local_48 = local_28;
    tokenize<v_array<substring>>
              (in_stack_fffffffffffffe77,in_stack_fffffffffffffe78,in_stack_fffffffffffffe68,
               (bool)in_stack_fffffffffffffe67);
    sVar1 = v_array<substring>::size((v_array<substring> *)local_18[1]);
    bVar2 = false;
    if (sVar1 != 0) {
      local_60 = v_array<substring>::last((v_array<substring> *)local_18[1]);
      bVar2 = true;
      if (local_60.end != local_38) {
        local_70 = v_array<substring>::last((v_array<substring> *)local_18[1]);
        bVar2 = *local_70.begin == '\'';
      }
    }
    if (bVar2) {
      local_80 = v_array<substring>::pop((v_array<substring> *)local_18[1]);
      if (*local_80.begin == '\'') {
        local_80.begin = local_80.begin + 1;
      }
      push_many<char>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                      (size_t)in_stack_fffffffffffffe30);
    }
  }
  sVar1 = v_array<substring>::size((v_array<substring> *)local_18[1]);
  if (sVar1 != 0) {
    (**(code **)(local_18[1] + 0x340))(local_18[1],*local_18,local_20 + 0x6828,local_18[1]);
  }
  if (((*(byte *)(local_18 + 0x687) & 1) == 0) && ((*(byte *)(local_18 + 0x6c3) & 1) == 0)) {
    TC_parser<false>::TC_parser
              ((TC_parser<false> *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (char *)in_stack_fffffffffffffe68,
               (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    TC_parser<false>::~TC_parser((TC_parser<false> *)&stack0xfffffffffffffe30);
  }
  else {
    TC_parser<true>::TC_parser
              ((TC_parser<true> *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (char *)in_stack_fffffffffffffe68,
               (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    TC_parser<true>::~TC_parser(&local_128);
  }
  return;
}

Assistant:

void substring_to_example(vw* all, example* ae, substring example)
{
  all->p->lp.default_label(&ae->l);
  char* bar_location = safe_index(example.begin, '|', example.end);
  char* tab_location = safe_index(example.begin, '\t', bar_location);
  substring label_space;
  if (tab_location != bar_location)
  {
    label_space.begin = tab_location + 1;
  }
  else
  {
    label_space.begin = example.begin;
  }
  label_space.end = bar_location;

  if (*example.begin == '|')
  {
    all->p->words.clear();
  }
  else
  {
    tokenize(' ', label_space, all->p->words);
    if (all->p->words.size() > 0 &&
        (all->p->words.last().end == label_space.end ||
            *(all->p->words.last().begin) == '\''))  // The last field is a tag, so record and strip it off
    {
      substring tag = all->p->words.pop();
      if (*tag.begin == '\'')
        tag.begin++;
      push_many(ae->tag, tag.begin, tag.end - tag.begin);
    }
  }

  if (all->p->words.size() > 0)
    all->p->lp.parse_label(all->p, all->sd, &ae->l, all->p->words);

  if (all->audit || all->hash_inv)
    TC_parser<true> parser_line(bar_location, example.end, *all, ae);
  else
    TC_parser<false> parser_line(bar_location, example.end, *all, ae);
}